

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O1

void debugFindParent(DdManager *table,DdNode *node)

{
  DdNode **ppDVar1;
  DdNode *pDVar2;
  long lVar3;
  long lVar4;
  DdNode *pDVar5;
  long lVar6;
  
  lVar4 = 0;
  while( true ) {
    lVar3 = 0x7fffffff;
    if ((ulong)node->index != 0x7fffffff) {
      lVar3 = (long)table->perm[node->index];
    }
    if (lVar3 <= lVar4) break;
    lVar3 = (long)(int)table->subtables[lVar4].slots;
    if (0 < lVar3) {
      ppDVar1 = table->subtables[lVar4].nodelist;
      lVar6 = 0;
      do {
        for (pDVar5 = ppDVar1[lVar6]; pDVar5 != (DdNode *)0x0; pDVar5 = pDVar5->next) {
          pDVar2 = (pDVar5->type).kids.T;
          if ((pDVar2 == node) ||
             ((DdNode *)((ulong)(pDVar5->type).kids.E & 0xfffffffffffffffe) == node)) {
            fprintf((FILE *)table->out,
                    "parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",pDVar5,
                    (ulong)pDVar5->index,(ulong)pDVar5->ref,pDVar2,(pDVar5->type).kids.E);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar3);
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

static void
debugFindParent(
  DdManager * table,
  DdNode * node)
{
    int         i,j;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;

    for (i = 0; i < cuddI(table,node->index); i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        for (j=0;j<slots;j++) {
            f = nodelist[j];
            while (f != NULL) {
                if (cuddT(f) == node || Cudd_Regular(cuddE(f)) == node) {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out,"parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                        (ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
                    (void) fprintf(table->out,"parent is at 0x%x, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",
                        (ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
                }
                f = f->next;
            }
        }
    }

}